

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil_rand.c
# Opt level: O1

int evutil_secure_rng_set_urandom_device_file(char *fname)

{
  if (arc4rand_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,arc4rand_lock);
  }
  arc4random_urandom_filename = fname;
  if (arc4rand_lock != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,arc4rand_lock);
  }
  return 0;
}

Assistant:

int
evutil_secure_rng_set_urandom_device_file(char *fname)
{
#ifdef TRY_SEED_URANDOM
	ARC4_LOCK_();
	arc4random_urandom_filename = fname;
	ARC4_UNLOCK_();
#endif
	return 0;
}